

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20240722::debugging_internal::Demangle(char *mangled,char *out,size_t out_size)

{
  byte bVar1;
  bool bVar2;
  bool local_59;
  undefined1 local_58 [8];
  State state;
  size_t out_size_local;
  char *out_local;
  char *mangled_local;
  
  state._40_8_ = out_size;
  if ((*mangled == '_') && (mangled[1] == 'R')) {
    bVar1 = absl::lts_20240722::debugging_internal::DemangleRustSymbolEncoding(mangled,out,out_size)
    ;
    mangled_local._7_1_ = (bool)(bVar1 & 1);
  }
  else {
    InitState((State *)local_58,mangled,out,out_size);
    bVar2 = ParseTopLevelMangledName((State *)local_58);
    local_59 = false;
    if (bVar2) {
      bVar2 = Overflowed((State *)local_58);
      local_59 = false;
      if (!bVar2) {
        local_59 = 0 < state.steps;
      }
    }
    mangled_local._7_1_ = local_59;
  }
  return mangled_local._7_1_;
}

Assistant:

bool Demangle(const char* mangled, char* out, size_t out_size) {
  if (mangled[0] == '_' && mangled[1] == 'R') {
    return DemangleRustSymbolEncoding(mangled, out, out_size);
  }

  State state;
  InitState(&state, mangled, out, out_size);
  return ParseTopLevelMangledName(&state) && !Overflowed(&state) &&
         state.parse_state.out_cur_idx > 0;
}